

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O0

void Hex::Hexdumper_base::clearflags(ostream *os)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  ostream *os_local;
  
  lVar1 = *(long *)(*(long *)os + -0x18);
  iVar2 = __flags();
  plVar3 = std::ios_base::iword((ios_base *)(os + lVar1),iVar2);
  *plVar3 = 0;
  lVar1 = *(long *)(*(long *)os + -0x18);
  iVar2 = __step();
  plVar3 = std::ios_base::iword((ios_base *)(os + lVar1),iVar2);
  *plVar3 = 0;
  lVar1 = *(long *)(*(long *)os + -0x18);
  iVar2 = __threshold();
  plVar3 = std::ios_base::iword((ios_base *)(os + lVar1),iVar2);
  *plVar3 = 2;
  return;
}

Assistant:

static void clearflags(std::ostream& os) {
        os.iword(__flags()) = 0;
        os.iword(__step()) = 0;
        os.iword(__threshold()) = 2;
    }